

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser.cc
# Opt level: O1

bool CLParser::FilterInputFilename(string *line)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  size_type sVar9;
  char cVar10;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  sVar2 = line->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (line->_M_dataplus)._M_p;
    sVar9 = 0;
    do {
      cVar1 = pcVar3[sVar9];
      cVar10 = cVar1 + ' ';
      if (0x19 < (byte)(cVar1 + 0xbfU)) {
        cVar10 = cVar1;
      }
      pcVar3[sVar9] = cVar10;
      sVar9 = sVar9 + 1;
    } while (sVar2 != sVar9);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,".c","");
  bVar6 = anon_unknown.dwarf_4fa23::EndsWith(line,&local_50);
  bVar8 = true;
  if (!bVar6) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,".cc","");
    bVar7 = anon_unknown.dwarf_4fa23::EndsWith(line,&local_70);
    if (!bVar7) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,".cxx","");
      bVar8 = anon_unknown.dwarf_4fa23::EndsWith(line,&local_90);
      if (bVar8) {
        bVar4 = false;
      }
      else {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,".cpp","");
        bVar8 = anon_unknown.dwarf_4fa23::EndsWith(line,&local_b0);
        if (!bVar8) {
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,".c++","");
          bVar8 = anon_unknown.dwarf_4fa23::EndsWith(line,&local_d0);
          bVar5 = true;
          bVar4 = true;
          bVar7 = true;
          goto LAB_0010ddef;
        }
        bVar4 = true;
      }
      bVar7 = false;
      bVar5 = true;
      bVar8 = true;
      goto LAB_0010ddef;
    }
  }
  bVar5 = false;
  bVar4 = false;
  bVar7 = false;
LAB_0010ddef:
  if ((bVar7) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2)) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((bVar4) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2)) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((bVar5) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2)) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((!bVar6) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar8;
}

Assistant:

bool CLParser::FilterInputFilename(string line) {
  transform(line.begin(), line.end(), line.begin(), ToLowerASCII);
  // TODO: other extensions, like .asm?
  return EndsWith(line, ".c") ||
      EndsWith(line, ".cc") ||
      EndsWith(line, ".cxx") ||
      EndsWith(line, ".cpp") ||
      EndsWith(line, ".c++");
}